

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

void __thiscall
StringEqualNoCaseFailure::StringEqualNoCaseFailure
          (StringEqualNoCaseFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          char *expected,char *actual,SimpleString *text)

{
  SimpleString *this_00;
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_00164c98;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffa0,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)&stack0xffffffffffffffa0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa0);
  StringFromOrNull(&stack0xffffffffffffffb0);
  StringFromOrNull(&stack0xffffffffffffffc0);
  pcVar3 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffb0);
  pcVar4 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffc0);
  StringFromFormat(&stack0xffffffffffffffa0,"expected <%s>\n\tbut was  <%s>",pcVar3,pcVar4);
  SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffa0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb0);
  if (actual != (char *)0x0 && expected != (char *)0x0) {
    lVar5 = 0;
    while( true ) {
      cVar1 = SimpleString::ToLower(actual[lVar5]);
      cVar2 = SimpleString::ToLower(expected[lVar5]);
      if (cVar1 != cVar2) break;
      lVar5 = lVar5 + 1;
    }
    SimpleString::SimpleString((SimpleString *)&stack0xffffffffffffffb0,actual);
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)&stack0xffffffffffffffa0,(SimpleString *)actual,
               (size_t)&stack0xffffffffffffffb0,(DifferenceFormat)lVar5);
    SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffa0);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa0);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

StringEqualNoCaseFailure::StringEqualNoCaseFailure(UtestShell* test, const char* fileName, size_t lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromOrNull(expected), StringFromOrNull(actual));
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; SimpleString::ToLower(actual[failStart]) == SimpleString::ToLower(expected[failStart]); failStart++)
            ;
        message_ += createDifferenceAtPosString(actual, failStart);
    }
}